

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas1_d.cpp
# Opt level: O1

void dscal(int n,double sa,double *x,int incx)

{
  double *pdVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  
  if (0 < n) {
    if (incx == 1) {
      uVar2 = (uint)n % 5;
      if (uVar2 != 0) {
        uVar4 = 0;
        do {
          x[uVar4] = x[uVar4] * sa;
          uVar4 = uVar4 + 1;
        } while (uVar2 != uVar4);
      }
      if ((int)uVar2 < n) {
        uVar4 = (ulong)(uint)n / 5;
        pdVar1 = x + uVar4 * -5 + (ulong)(uint)n + 4;
        iVar3 = n + (int)uVar4 * -5;
        do {
          pdVar1[-4] = pdVar1[-4] * sa;
          pdVar1[-3] = pdVar1[-3] * sa;
          pdVar1[-2] = pdVar1[-2] * sa;
          pdVar1[-1] = pdVar1[-1] * sa;
          *pdVar1 = *pdVar1 * sa;
          pdVar1 = pdVar1 + 5;
          iVar3 = iVar3 + 5;
        } while (iVar3 < n);
      }
    }
    else {
      pdVar1 = x + (incx >> 0x1f & (1 - n) * incx);
      do {
        *pdVar1 = *pdVar1 * sa;
        pdVar1 = pdVar1 + incx;
        n = n + -1;
      } while (n != 0);
    }
  }
  return;
}

Assistant:

void dscal ( int n, double sa, double x[], int incx )

//****************************************************************************80
//
//  Purpose:
//
//    DSCAL scales a vector by a constant.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    02 May 2005
//
//  Author:
//
//    Original FORTRAN77 version by Charles Lawson, Richard Hanson, 
//    David Kincaid, Fred Krogh.
//    C++ version by John Burkardt.
//
//  Reference:
//
//    Jack Dongarra, Jim Bunch, Cleve Moler, Pete Stewart,
//    LINPACK User's Guide,
//    SIAM, 1979,
//    ISBN13: 978-0-898711-72-1,
//    LC: QA214.L56.
//
//    Charles Lawson, Richard Hanson, David Kincaid, Fred Krogh,
//    Basic Linear Algebra Subprograms for Fortran Usage,
//    Algorithm 539,
//    ACM Transactions on Mathematical Software,
//    Volume 5, Number 3, September 1979, pages 308-323.
//
//  Parameters:
//
//    Input, int N, the number of entries in the vector.
//
//    Input, double SA, the multiplier.
//
//    Input/output, double X[*], the vector to be scaled.
//
//    Input, int INCX, the increment between successive entries of X.
//
{
  int i;
  int ix;
  int m;

  if ( n <= 0 )
  {
  }
  else if ( incx == 1 )
  {
    m = n % 5;

    for ( i = 0; i < m; i++ )
    {
      x[i] = sa * x[i];
    }

    for ( i = m; i < n; i = i + 5 )
    {
      x[i]   = sa * x[i];
      x[i+1] = sa * x[i+1];
      x[i+2] = sa * x[i+2];
      x[i+3] = sa * x[i+3];
      x[i+4] = sa * x[i+4];
    }
  }
  else
  {
    if ( 0 <= incx )
    {
      ix = 0;
    }
    else
    {
      ix = ( - n + 1 ) * incx;
    }

    for ( i = 0; i < n; i++ )
    {
      x[ix] = sa * x[ix];
      ix = ix + incx;
    }

  }

  return;
}